

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  action *paVar1;
  action *paVar2;
  long lVar3;
  bool bVar4;
  
  paVar2 = Action_new_actionfreelist;
  if (Action_new_actionfreelist == (action *)0x0) {
    paVar2 = (action *)calloc(100,0x30);
    if (paVar2 == (action *)0x0) {
      Action_new_actionfreelist = paVar2;
      fwrite("Unable to allocate memory for a new parser action.",0x32,1,_stderr);
      exit(1);
    }
    lVar3 = 99;
    paVar1 = paVar2;
    while( true ) {
      bVar4 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar4) break;
      paVar1->next = paVar1 + 1;
      paVar1 = paVar1 + 1;
    }
    paVar2[99].next = (action *)0x0;
  }
  Action_new_actionfreelist = paVar2->next;
  paVar2->next = *app;
  *app = paVar2;
  paVar2->type = type;
  paVar2->sp = sp;
  paVar2->spOpt = (symbol *)0x0;
  (paVar2->x).stp = (state *)arg;
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}